

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hash_table.cpp
# Opt level: O2

uint __thiscall ON_Hash32Table::RemoveAllItems(ON_Hash32Table *this,ON_FixedSizePool *fsp)

{
  ON_Hash32TableItem *pOVar1;
  size_t __n;
  size_t sVar2;
  ulong uVar3;
  ON_Hash32TableItem *__s;
  uint removed_item_count;
  uint uVar4;
  
  __n = ON_FixedSizePool::SizeofElement(fsp);
  sVar2 = ON_FixedSizePool::ActiveElementCount(fsp);
  if (0xf < __n) {
    uVar4 = this->m_item_count;
    if (uVar4 <= sVar2) {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else if (sVar2 == uVar4) {
        uVar4 = 0;
        for (uVar3 = 0; uVar3 < this->m_hash_table_capacity; uVar3 = uVar3 + 1) {
          __s = this->m_hash_table[uVar3];
          if (__s != (ON_Hash32TableItem *)0x0) {
            this->m_hash_table[uVar3] = (ON_Hash32TableItem *)0x0;
            while (__s != (ON_Hash32TableItem *)0x0) {
              pOVar1 = __s->m_internal_next;
              memset(__s,0,__n);
              ON_FixedSizePool::ReturnElement(fsp,__s);
              uVar4 = uVar4 + 1;
              __s = pOVar1;
            }
          }
        }
      }
      else {
        this->m_item_count = 0;
        memset(this->m_hash_table,0,(ulong)this->m_hash_table_capacity << 3);
        ON_FixedSizePool::ReturnAll(fsp);
      }
      if (uVar4 != this->m_item_count) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hash_table.cpp"
                   ,0x12f,"","Corrupt hash table.");
      }
      this->m_item_count = 0;
      return uVar4;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hash_table.cpp"
             ,0x10c,"","Invalid fsp parameter.");
  uVar4 = this->m_item_count;
  this->m_item_count = 0;
  memset(this->m_hash_table,0,(ulong)this->m_hash_table_capacity << 3);
  return uVar4;
}

Assistant:

unsigned int ON_Hash32Table::RemoveAllItems(
  class ON_FixedSizePool& fsp
)
{
  const size_t sizeof_item = fsp.SizeofElement();
  const size_t fsp_item_count = fsp.ActiveElementCount();
  if (sizeof_item < sizeof(ON_Hash32TableItem) || fsp_item_count < (size_t)m_item_count)
  {
    ON_ERROR("Invalid fsp parameter.");
    return RemoveAllItems();
  }

  unsigned int removed_item_count = 0;
  if (m_item_count > 0)
  {
    const bool bReturnItem = (fsp_item_count == (size_t)m_item_count);
    if (false == bReturnItem)
    {
      removed_item_count = RemoveAllItems();
      fsp.ReturnAll();
    }
    else
    {
      for (ON__UINT32 i = 0; i < m_hash_table_capacity; i++)
      {
        ON_Hash32TableItem* p = m_hash_table[i];
        if (nullptr == p)
          continue;
        m_hash_table[i] = nullptr;
        while (nullptr != p)
        {
          ON_Hash32TableItem* next = p->m_internal_next;
          memset(p, 0, sizeof_item);
          fsp.ReturnElement(p);
          p = next;
          removed_item_count++;
        }
      }
    }
  }

  if (removed_item_count != m_item_count)
  {
    ON_ERROR("Corrupt hash table.");
  }
  m_item_count = 0;
  return removed_item_count;
}